

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O1

DiffuseMaterial *
pbrt::DiffuseMaterial::Create
          (TextureParameterDictionary *parameters,Image *normalMap,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  int iVar2;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DiffuseMaterial *pDVar3;
  uintptr_t iptr;
  SpectrumTextureHandle reflectance;
  FloatTextureHandle displacement;
  FloatTextureHandle sigma;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_70 [2];
  long local_60 [2];
  undefined1 local_50 [16];
  TextureParameterDictionary local_40;
  undefined4 extraout_var_01;
  
  local_70[0].bits = (uintptr_t)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"reflectance","");
  local_40.textures = (NamedTextures *)0x0;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)local_50,(string *)parameters,(SpectrumHandle *)local_70,
             (int)&local_40 + 8,(Allocator)0x0);
  if ((long *)local_70[0].bits != local_60) {
    operator_delete((void *)local_70[0].bits,local_60[0] + 1);
  }
  if ((local_50._0_8_ & 0xffffffffffff) == 0) {
    iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0x3f000000;
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,8);
    *(ulong *)CONCAT44(extraout_var_00,iVar2) = CONCAT44(extraout_var,iVar1) | 0x1000000000000;
    local_50._0_8_ = CONCAT44(extraout_var_00,iVar2) | 0x5000000000000;
  }
  local_70[0].bits = (uintptr_t)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"sigma","");
  TextureParameterDictionary::GetFloatTexture
            (&local_40,(string *)parameters,0.0,(memory_resource *)local_70);
  if ((long *)local_70[0].bits != local_60) {
    operator_delete((void *)local_70[0].bits,local_60[0] + 1);
  }
  local_70[0].bits = (uintptr_t)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"displacement","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)(local_50 + 8),(string *)parameters,
             (memory_resource *)local_70);
  if ((long *)local_70[0].bits != local_60) {
    operator_delete((void *)local_70[0].bits,local_60[0] + 1);
  }
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
  pDVar3 = (DiffuseMaterial *)CONCAT44(extraout_var_01,iVar1);
  (pDVar3->displacement).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_50._8_8_;
  pDVar3->normalMap = normalMap;
  (pDVar3->reflectance).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_50._0_8_;
  (pDVar3->sigma).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)local_40.dict;
  return pDVar3;
}

Assistant:

DiffuseMaterial *DiffuseMaterial::Create(const TextureParameterDictionary &parameters,
                                         Image *normalMap, const FileLoc *loc,
                                         Allocator alloc) {
    SpectrumTextureHandle reflectance = parameters.GetSpectrumTexture(
        "reflectance", nullptr, SpectrumType::Albedo, alloc);
    if (!reflectance)
        reflectance = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.5f));
    FloatTextureHandle sigma = parameters.GetFloatTexture("sigma", 0.f, alloc);
    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);

    return alloc.new_object<DiffuseMaterial>(reflectance, sigma, displacement, normalMap);
}